

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_64x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  long in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  __m256i l16;
  __m256i rep;
  __m256i l;
  int j;
  int i;
  __m256i one;
  __m256i tl;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  undefined8 local_3c0;
  undefined8 uStackY_3b8;
  undefined8 local_3b0;
  undefined8 uStackY_3a8;
  undefined8 local_3a0;
  undefined8 uStackY_398;
  undefined8 local_390;
  undefined8 uStackY_388;
  undefined1 auVar9 [24];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  int local_308;
  int local_304;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  uint8_t local_2c0 [128];
  long local_240;
  __m256i *local_238;
  uint8_t *local_230;
  uint8_t *local_228;
  undefined1 local_220 [16];
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined2 local_1c6;
  undefined2 local_1c4;
  ushort local_1c2;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  uint8_t *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  uint8_t *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  uint8_t *local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  uint8_t *local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [32];
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_240 = in_RCX;
  local_238 = in_RDX;
  local_230 = in_RSI;
  local_228 = in_RDI;
  get_top_vector(in_RDX,in_RSI);
  get_top_vector((__m256i *)(*local_238 + 2),in_RSI);
  get_top_vector(local_238 + 1,in_RSI);
  get_top_vector((__m256i *)(local_238[1] + 2),in_RSI);
  local_1c2 = (ushort)*(byte *)((long)local_238[-1] + 0x1f);
  auVar5 = vpinsrw_avx(ZEXT216(local_1c2),(uint)local_1c2,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,6);
  local_100 = vpinsrw_avx(auVar5,(uint)local_1c2,7);
  auVar5 = vpinsrw_avx(ZEXT216(local_1c2),(uint)local_1c2,1);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,2);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,3);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,4);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,5);
  auVar5 = vpinsrw_avx(auVar5,(uint)local_1c2,6);
  auStack_f0 = vpinsrw_avx(auVar5,(uint)local_1c2,7);
  local_1c4 = 1;
  local_82 = 1;
  local_84 = 1;
  local_86 = 1;
  local_88 = 1;
  local_8a = 1;
  local_8c = 1;
  local_8e = 1;
  local_90 = 1;
  local_92 = 1;
  local_94 = 1;
  local_96 = 1;
  local_98 = 1;
  local_9a = 1;
  local_9c = 1;
  local_9e = 1;
  local_a0 = 1;
  auVar5 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar5 = vpinsrw_avx(auVar5,1,2);
  auVar5 = vpinsrw_avx(auVar5,1,3);
  auVar5 = vpinsrw_avx(auVar5,1,4);
  auVar5 = vpinsrw_avx(auVar5,1,5);
  auVar5 = vpinsrw_avx(auVar5,1,6);
  auVar5 = vpinsrw_avx(auVar5,1,7);
  auVar4 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar4 = vpinsrw_avx(auVar4,1,2);
  auVar4 = vpinsrw_avx(auVar4,1,3);
  auVar4 = vpinsrw_avx(auVar4,1,4);
  auVar4 = vpinsrw_avx(auVar4,1,5);
  auVar4 = vpinsrw_avx(auVar4,1,6);
  auVar4 = vpinsrw_avx(auVar4,1,7);
  auVar6._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
  auVar6._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
  auVar7 = auVar6;
  local_e0 = local_1c2;
  local_de = local_1c2;
  local_dc = local_1c2;
  local_da = local_1c2;
  local_d8 = local_1c2;
  local_d6 = local_1c2;
  local_d4 = local_1c2;
  local_d2 = local_1c2;
  local_d0 = local_1c2;
  local_ce = local_1c2;
  local_cc = local_1c2;
  local_ca = local_1c2;
  local_c8 = local_1c2;
  local_c6 = local_1c2;
  local_c4 = local_1c2;
  local_c2 = local_1c2;
  local_c0 = auVar6;
  for (local_308 = 0; local_308 < 2; local_308 = local_308 + 1) {
    get_left_vector((__m256i *)(local_240 + (local_308 << 4)),in_RSI);
    local_1c6 = 0x8000;
    local_32 = 0x8000;
    local_34 = 0x8000;
    local_36 = 0x8000;
    local_38 = 0x8000;
    local_3a = 0x8000;
    local_3c = 0x8000;
    local_3e = 0x8000;
    local_40 = 0x8000;
    local_42 = 0x8000;
    local_44 = 0x8000;
    local_46 = 0x8000;
    local_48 = 0x8000;
    local_4a = 0x8000;
    local_4c = 0x8000;
    local_4e = 0x8000;
    local_50 = 0x8000;
    auVar5 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar5 = vpinsrw_avx(auVar5,0x8000,2);
    auVar5 = vpinsrw_avx(auVar5,0x8000,3);
    auVar5 = vpinsrw_avx(auVar5,0x8000,4);
    auVar5 = vpinsrw_avx(auVar5,0x8000,5);
    auVar5 = vpinsrw_avx(auVar5,0x8000,6);
    auVar5 = vpinsrw_avx(auVar5,0x8000,7);
    auVar4 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar4 = vpinsrw_avx(auVar4,0x8000,2);
    auVar4 = vpinsrw_avx(auVar4,0x8000,3);
    auVar4 = vpinsrw_avx(auVar4,0x8000,4);
    auVar4 = vpinsrw_avx(auVar4,0x8000,5);
    auVar4 = vpinsrw_avx(auVar4,0x8000,6);
    auVar4 = vpinsrw_avx(auVar4,0x8000,7);
    auVar8._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
    auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar5;
    local_80 = auVar8;
    for (local_304 = 0; local_304 < 0x10; local_304 = local_304 + 1) {
      local_340 = auVar7._0_8_;
      uStack_338 = auVar7._8_8_;
      uStack_330 = auVar7._16_8_;
      uStack_328 = auVar7._24_8_;
      local_360 = auVar8._0_8_;
      uStack_358 = auVar8._8_8_;
      uStack_350 = auVar8._16_8_;
      uStack_348 = auVar8._24_8_;
      local_1a0 = local_340;
      uStack_198 = uStack_338;
      uStack_190 = uStack_330;
      uStack_188 = uStack_328;
      local_1c0 = local_360;
      uStack_1b8 = uStack_358;
      uStack_1b0 = uStack_350;
      uStack_1a8 = uStack_348;
      auVar1 = vpshufb_avx2(auVar7,auVar8);
      auVar9 = auVar1._0_24_;
      auVar2 = auVar1._0_16_;
      paeth_16x1_pred(auVar1._16_8_,auVar1._8_8_,auVar1._0_8_);
      auVar3 = auVar2;
      paeth_16x1_pred(auVar9._16_8_,auVar9._8_8_,auVar9._0_8_);
      auVar4 = auVar3;
      paeth_16x1_pred(auVar9._16_8_,auVar9._8_8_,auVar9._0_8_);
      in_RSI = local_2c0;
      auVar5 = auVar4;
      paeth_16x1_pred(auVar9._16_8_,auVar9._8_8_,auVar9._0_8_);
      local_108 = local_228;
      local_390 = auVar2._0_8_;
      local_120 = local_390;
      uStackY_388 = auVar2._8_8_;
      uStack_118 = uStackY_388;
      *(undefined8 *)local_228 = local_390;
      *(undefined8 *)(local_228 + 8) = uStackY_388;
      local_128 = local_228 + 0x10;
      local_3a0 = auVar3._0_8_;
      local_140 = local_3a0;
      uStackY_398 = auVar3._8_8_;
      uStack_138 = uStackY_398;
      *(undefined8 *)local_128 = local_3a0;
      *(undefined8 *)(local_228 + 0x18) = uStackY_398;
      local_148 = local_228 + 0x20;
      local_3b0 = auVar4._0_8_;
      local_160 = local_3b0;
      uStackY_3a8 = auVar4._8_8_;
      uStack_158 = uStackY_3a8;
      *(undefined8 *)local_148 = local_3b0;
      *(undefined8 *)(local_228 + 0x28) = uStackY_3a8;
      local_168 = local_228 + 0x30;
      local_3c0 = auVar5._0_8_;
      local_180 = local_3c0;
      uStackY_3b8 = auVar5._8_8_;
      uStack_178 = uStackY_3b8;
      *(undefined8 *)local_168 = local_3c0;
      *(undefined8 *)(local_228 + 0x38) = uStackY_3b8;
      local_228 = local_230 + (long)local_228;
      local_200 = local_360;
      uStack_1f8 = uStack_358;
      uStack_1f0 = uStack_350;
      uStack_1e8 = uStack_348;
      uStack_2f0 = auVar6._16_8_;
      uStack_210 = uStack_2f0;
      uStack_2e8 = auVar6._24_8_;
      uStack_208 = uStack_2e8;
      auVar1._16_8_ = uStack_2f0;
      auVar1._0_16_ = auVar6._0_16_;
      auVar1._24_8_ = uStack_2e8;
      auVar8 = vpaddw_avx2(auVar8,auVar1);
      local_220 = auVar6._0_16_;
    }
    auVar7 = auVar8;
  }
  return;
}

Assistant:

void aom_paeth_predictor_64x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i t2 = get_top_vector(above + 32);
  const __m256i t3 = get_top_vector(above + 48);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i, j;
  for (j = 0; j < 2; ++j) {
    const __m256i l = get_left_vector(left + j * 16);
    __m256i rep = _mm256_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      const __m256i l16 = _mm256_shuffle_epi8(l, rep);

      const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
      const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);
      const __m128i r2 = paeth_16x1_pred(&l16, &t2, &tl);
      const __m128i r3 = paeth_16x1_pred(&l16, &t3, &tl);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);
      _mm_store_si128((__m128i *)(dst + 32), r2);
      _mm_store_si128((__m128i *)(dst + 48), r3);

      dst += stride;
      rep = _mm256_add_epi16(rep, one);
    }
  }
}